

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_16x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  undefined1 (*in_RCX) [16];
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar2 [16];
  __m128i *extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i top1;
  __m128i top0;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i *in_stack_fffffffffffffe00;
  __m128i *in_stack_fffffffffffffe18;
  int local_1dc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_140;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  
  auVar1 = *in_RCX;
  local_1c8 = 0x8000800080008000;
  uStack_1c0 = 0x8000800080008000;
  local_140 = in_RDI;
  for (local_1dc = 0; local_1dc < 0x10; local_1dc = local_1dc + 1) {
    auVar2._8_8_ = uStack_1c0;
    auVar2._0_8_ = local_1c8;
    auVar2 = pshufb(auVar1,auVar2);
    paeth_16x1_pred(in_stack_fffffffffffffe18,auVar2._8_8_,auVar2._0_8_,in_stack_fffffffffffffe00);
    *local_140 = extraout_XMM0_Qa;
    local_140[1] = extraout_XMM0_Qb;
    local_140 = (undefined8 *)(in_RSI + (long)local_140);
    local_c8 = (short)local_1c8;
    sStack_c6 = (short)((ulong)local_1c8 >> 0x10);
    sStack_c4 = (short)((ulong)local_1c8 >> 0x20);
    sStack_c2 = (short)((ulong)local_1c8 >> 0x30);
    sStack_c0 = (short)uStack_1c0;
    sStack_be = (short)((ulong)uStack_1c0 >> 0x10);
    sStack_bc = (short)((ulong)uStack_1c0 >> 0x20);
    sStack_ba = (short)((ulong)uStack_1c0 >> 0x30);
    local_1c8 = CONCAT26(sStack_c2 + 1,CONCAT24(sStack_c4 + 1,CONCAT22(sStack_c6 + 1,local_c8 + 1)))
    ;
    uStack_1c0 = CONCAT26(sStack_ba + 1,
                          CONCAT24(sStack_bc + 1,CONCAT22(sStack_be + 1,sStack_c0 + 1)));
    in_stack_fffffffffffffe00 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  __m128i l = _mm_load_si128((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 16; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}